

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.cpp
# Opt level: O0

SyncPointVkPtr __thiscall
Diligent::CommandQueueVkImpl::CreateSyncPoint(CommandQueueVkImpl *this,Uint64 dbgValue)

{
  SoftwareQueueIndex CommandQueueId;
  byte bVar1;
  size_t Size;
  SyncPointVk *this_00;
  element_type *SyncObjectMngr;
  element_type *this_01;
  VkDevice LogicalDevice;
  Uint64 in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SyncPointVkPtr SVar2;
  anon_class_8_1_0a24c139_for__M_tp Deleter;
  void *ptr;
  FixedBlockMemoryAllocator *pAllocator;
  Uint64 dbgValue_local;
  CommandQueueVkImpl *this_local;
  
  Size = SyncPointVk::SizeOf((uint)*(byte *)(dbgValue + 0x2b));
  this_00 = (SyncPointVk *)
            FixedBlockMemoryAllocator::Allocate
                      ((FixedBlockMemoryAllocator *)(dbgValue + 0xa8),Size,"SyncPointVk",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
                       ,0x8c);
  CommandQueueId.m_Value = *(uchar *)(dbgValue + 0x29);
  bVar1 = *(byte *)(dbgValue + 0x2b);
  SyncObjectMngr =
       std::
       __shared_ptr_access<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
       ::operator*((__shared_ptr_access<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)(dbgValue + 0x98));
  this_01 = std::
            __shared_ptr_access<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)(dbgValue + 0x10));
  LogicalDevice = VulkanUtilities::VulkanLogicalDevice::GetVkDevice(this_01);
  SyncPointVk::SyncPointVk(this_00,CommandQueueId,(uint)bVar1,SyncObjectMngr,LogicalDevice,in_RDX);
  std::shared_ptr<Diligent::SyncPointVk>::
  shared_ptr<Diligent::SyncPointVk,Diligent::CommandQueueVkImpl::CreateSyncPoint(unsigned_long)::_lambda(Diligent::SyncPointVk*)_1_,void>
            ((shared_ptr<Diligent::SyncPointVk> *)this,this_00,
             (FixedBlockMemoryAllocator *)(dbgValue + 0xa8));
  SVar2.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar2.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SyncPointVkPtr)SVar2.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

__forceinline SyncPointVkPtr CommandQueueVkImpl::CreateSyncPoint(Uint64 dbgValue)
{
    auto* pAllocator = &m_SyncPointAllocator;
    void* ptr        = pAllocator->Allocate(SyncPointVk::SizeOf(m_NumCommandQueues), "SyncPointVk", __FILE__, __LINE__);
    auto  Deleter    = [pAllocator](SyncPointVk* ptr) //
    {
        ptr->~SyncPointVk();
        pAllocator->Free(ptr);
    };

    return {new (ptr) SyncPointVk{m_CommandQueueId, m_NumCommandQueues, *m_SyncObjectManager, m_LogicalDevice->GetVkDevice(), dbgValue}, std::move(Deleter)};
}